

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O2

bool ObjectTempVerify::IsTempTransfer(Instr *instr)

{
  bool bVar1;
  undefined8 in_RAX;
  RegOpnd *pRVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  bVar1 = ObjectTemp::IsTempTransfer(instr);
  if ((bVar1) || ((instr->m_opcode & ~ExtendedOpcodePrefix) == Ld_I4)) {
    if (((*(ushort *)&instr->field_0x36 & 8) == 0) && (instr->m_dst != (Opnd *)0x0)) {
      bVar1 = IR::Opnd::IsRegOpnd(instr->m_dst);
      if (bVar1) {
        pRVar2 = IR::Opnd::AsRegOpnd(instr->m_dst);
        uStack_18 = CONCAT26((pRVar2->super_Opnd).m_valueType.field_0.bits,(undefined6)uStack_18);
        bVar1 = ValueType::IsNotObject((ValueType *)((long)&uStack_18 + 6));
        if (bVar1) goto LAB_005beb22;
      }
    }
    bVar1 = true;
  }
  else {
LAB_005beb22:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
ObjectTempVerify::IsTempTransfer(IR::Instr * instr)
{
    if (ObjectTemp::IsTempTransfer(instr)
        // Add the Ld_I4, and LdC_A_I4 as the forward pass might have changed Ld_A to these
        || instr->m_opcode == Js::OpCode::Ld_I4
        || instr->m_opcode == Js::OpCode::LdC_A_I4)
    {
        if (!instr->dstIsTempObject && instr->GetDst() && instr->GetDst()->IsRegOpnd()
          && instr->GetDst()->AsRegOpnd()->GetValueType().IsNotObject())
        {
            // Globopt has proved that dst is not an object, so this is not really an object transfer.
            // This prevents the case where glob opt turned a Conv_Num to Ld_A and expose additional
            // transfer.
            return false;
        }
        return true;
    }
    return false;
}